

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_1::FixedFunctionOOB::draw(FixedFunctionOOB *this)

{
  undefined8 local_28;
  GLint bad_indices [6];
  FixedFunctionOOB *this_local;
  
  local_28 = 0xa00000000;
  bad_indices[0] = 100;
  bad_indices[1] = 1000;
  bad_indices[2] = 10000;
  bad_indices[3] = 100000;
  bad_indices._16_8_ = this;
  if ((this->super_ContextReset).m_fixedFunctionType == FIXEDFUNCTIONTYPE_INDICES) {
    (*((this->super_ContextReset).m_gl)->drawElements)(4,6,0x1405,&local_28);
  }
  else if ((this->super_ContextReset).m_fixedFunctionType == FIXEDFUNCTIONTYPE_VERTICES) {
    (*((this->super_ContextReset).m_gl)->drawArrays)(4,0,1000);
  }
  return;
}

Assistant:

void FixedFunctionOOB::draw (void)
{
	const glw::GLint bad_indices[] = {0, 10, 100, 1000, 10000, 100000};

	if (m_fixedFunctionType == FIXEDFUNCTIONTYPE_INDICES)
		m_gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_INT, bad_indices);
	else if (m_fixedFunctionType == FIXEDFUNCTIONTYPE_VERTICES)
		m_gl.drawArrays(GL_TRIANGLES, 0, 1000);
	else
		DE_FATAL("Unknown fixed function type");
}